

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linde_buzo_gray_algorithm.cc
# Opt level: O1

bool __thiscall
sptk::LindeBuzoGrayAlgorithm::Run
          (LindeBuzoGrayAlgorithm *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *input_vectors,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *codebook_vectors,vector<int,_std::allocator<int>_> *codebook_indices,
          double *total_distance)

{
  pointer pvVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  vector<double,_std::allocator<double>_> *this_00;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  StatisticsAccumulation *pSVar15;
  double dVar16;
  int index;
  double random_value;
  vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
  buffers;
  NormalDistributedRandomValueGeneration random_value_generation;
  int local_114;
  int local_10c;
  double local_108;
  ulong local_100;
  double local_f8;
  StatisticsAccumulation *local_f0;
  ulong local_e8;
  undefined8 local_e0;
  uint local_d4;
  vector<int,_std::allocator<int>_> *local_d0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_c8;
  ulong local_c0;
  VectorQuantization *local_b8;
  vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
  local_b0;
  double local_98;
  double *local_90;
  size_type local_88;
  DistanceCalculation *local_80;
  long local_78;
  long local_70;
  NormalDistributedRandomValueGeneration local_68;
  
  if (this->is_valid_ == true) {
    if (total_distance == (double *)0x0) {
      return false;
    }
    if (codebook_indices == (vector<int,_std::allocator<int>_> *)0x0) {
      return false;
    }
    if (codebook_vectors ==
        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)0x0) {
      return false;
    }
    uVar12 = ((long)(input_vectors->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(input_vectors->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    uVar11 = (uint)uVar12;
    if ((int)uVar11 < this->target_codebook_size_ * this->min_num_vector_in_cluster_) {
      return false;
    }
    if (((long)(codebook_vectors->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(codebook_vectors->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
        (long)this->initial_codebook_size_ == 0) {
      local_d0 = codebook_indices;
      local_c8 = input_vectors;
      if ((long)(codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2 != (long)(int)uVar11) {
        std::vector<int,_std::allocator<int>_>::resize(codebook_indices,(long)(int)uVar11);
      }
      std::
      vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
      ::vector(&local_b0,(long)this->target_codebook_size_,(allocator_type *)&local_68);
      NormalDistributedRandomValueGeneration::NormalDistributedRandomValueGeneration
                (&local_68,this->seed_);
      *total_distance = 1.79769313486232e+308;
      local_d4 = this->initial_codebook_size_;
      pSVar15 = &this->statistics_accumulation_;
      local_b8 = &this->vector_quantization_;
      local_98 = (double)(int)uVar11;
      local_80 = &this->distance_calculation_;
      local_70 = (long)(int)uVar11;
      local_78 = -(ulong)(uVar11 & 0x7fffffff);
      local_100 = uVar12;
      local_f0 = pSVar15;
      local_90 = total_distance;
      do {
        local_e8 = (ulong)local_d4;
        uVar10 = local_d4 * 2;
        local_108 = (double)CONCAT71(local_108._1_7_,this->target_codebook_size_ < (int)uVar10);
        if (this->target_codebook_size_ < (int)uVar10) goto LAB_00107051;
        local_88 = (size_type)(int)uVar10;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(codebook_vectors,local_88);
        for (this_00 = (codebook_vectors->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + (int)local_e8;
            this_00 !=
            (codebook_vectors->
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
          std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->num_order_ + 1);
        }
        local_d4 = uVar10;
        if (0 < (int)local_e8) {
          uVar12 = local_e8 & 0xffffffff;
          uVar13 = 0;
          do {
            uVar10 = (uint)this->num_order_ >> 0x1f;
            if (-1 < this->num_order_) {
              lVar9 = -1;
              do {
                bVar2 = NormalDistributedRandomValueGeneration::Get(&local_68,(double *)&local_e0);
                if (!bVar2) break;
                dVar16 = this->splitting_factor_ * (double)CONCAT44(local_e0._4_4_,(int)local_e0);
                pvVar1 = (codebook_vectors->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar13;
                lVar8 = *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data;
                *(double *)
                 (*(long *)&pvVar1[uVar12].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl + 8 + lVar9 * 8) = *(double *)(lVar8 + 8 + lVar9 * 8) - dVar16;
                *(double *)(lVar8 + 8 + lVar9 * 8) = dVar16 + *(double *)(lVar8 + 8 + lVar9 * 8);
                lVar9 = lVar9 + 1;
                uVar10 = (uint)(this->num_order_ <= lVar9);
              } while (lVar9 < this->num_order_);
            }
          } while ((uVar10 != 0) && (uVar13 = uVar13 + 1, uVar13 != uVar12));
          pSVar15 = local_f0;
          if (uVar10 == 0) goto LAB_00107051;
        }
        if (0 < this->num_iteration_) {
          bVar2 = 0 < (int)local_e8;
          local_c0 = 1;
          if (1 < (int)local_d4) {
            local_c0 = (ulong)local_d4;
          }
          lVar9 = local_c0 << 7;
          iVar5 = 0;
          local_f8 = 1.79769313486232e+308;
          uVar12 = local_100;
          do {
            if (0 < (int)local_e8) {
              lVar8 = 0;
              do {
                StatisticsAccumulation::Clear
                          (pSVar15,(Buffer *)
                                   ((long)&(local_b0.
                                            super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_vptr_Buffer
                                   + lVar8));
                lVar8 = lVar8 + 0x80;
              } while (lVar9 != lVar8);
            }
            local_114 = 0x14;
            bVar4 = 0 < (int)uVar11;
            if ((int)uVar12 < 1) {
              local_108 = 0.0;
            }
            else {
              local_108 = 0.0;
              lVar14 = 1;
              lVar8 = 0;
              do {
                bVar3 = VectorQuantization::Run
                                  (local_b8,(vector<double,_std::allocator<double>_> *)
                                            ((long)&(((local_c8->
                                                                                                            
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar8),
                                   codebook_vectors,&local_10c);
                if (bVar3) {
                  (local_d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar14 + -1] = local_10c;
                  bVar3 = StatisticsAccumulation::Run
                                    (local_f0,(vector<double,_std::allocator<double>_> *)
                                              ((long)&(((local_c8->
                                                                                                                
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar8),
                                     local_b0.
                                     super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                     ._M_impl.super__Vector_impl_data._M_start + local_10c);
                  if (!bVar3) goto LAB_00106d3e;
                  bVar3 = DistanceCalculation::Run
                                    (local_80,(vector<double,_std::allocator<double>_> *)
                                              ((long)&(((local_c8->
                                                                                                                
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar8),
                                     (codebook_vectors->
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + local_10c,
                                     (double *)&local_e0);
                  if (bVar3) {
                    local_108 = local_108 + (double)CONCAT44(local_e0._4_4_,(int)local_e0);
                  }
                }
                else {
LAB_00106d3e:
                  bVar3 = false;
                }
                uVar12 = local_100;
                pSVar15 = local_f0;
                if (bVar3 == false) {
                  local_114 = 1;
                  break;
                }
                bVar4 = lVar14 < local_70;
                lVar8 = lVar8 + 0x18;
                lVar6 = local_78 + lVar14;
                lVar14 = lVar14 + 1;
              } while (lVar6 != 0);
            }
            if (!bVar4) {
              dVar16 = local_108 / local_98;
              *local_90 = dVar16;
              local_114 = 0xe;
              if (((dVar16 != 0.0) || (NAN(dVar16))) &&
                 (local_108 = dVar16,
                 this->convergence_threshold_ <= ABS(local_f8 - dVar16) / dVar16)) {
                bVar4 = bVar2;
                if ((int)local_e8 < 1) {
                  local_114 = 0x17;
                  local_f8 = -NAN;
                }
                else {
                  local_114 = -1;
                  uVar12 = 0;
                  local_f8 = (double)((ulong)local_f8 & 0xffffffff00000000);
                  do {
                    bVar3 = StatisticsAccumulation::GetNumData
                                      (local_f0,local_b0.
                                                super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar12,
                                       (int *)&local_e0);
                    if (bVar3) {
                      if (local_f8._0_4_ < (int)local_e0) {
                        local_114 = (int)uVar12;
                      }
                      iVar7 = local_f8._0_4_;
                      if (local_f8._0_4_ <= (int)local_e0) {
                        iVar7 = (int)local_e0;
                      }
                      local_f8 = (double)CONCAT44(local_f8._4_4_,iVar7);
                      if ((this->min_num_vector_in_cluster_ <= (int)local_e0) &&
                         (bVar3 = StatisticsAccumulation::GetMean
                                            (local_f0,local_b0.
                                                  super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar12
                                             ,(codebook_vectors->
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar12),
                         !bVar3)) goto LAB_00106e92;
                      bVar3 = true;
                    }
                    else {
LAB_00106e92:
                      bVar3 = false;
                    }
                    if (!bVar3) {
                      iVar7 = 1;
                      goto LAB_00106ed3;
                    }
                    uVar12 = uVar12 + 1;
                    bVar4 = (long)uVar12 < (long)local_88;
                  } while (uVar12 != local_c0);
                  iVar7 = 0x17;
LAB_00106ed3:
                  local_f8 = (double)(long)local_114;
                  uVar12 = local_100;
                  local_114 = iVar7;
                }
                pSVar15 = local_f0;
                if (bVar4) {
                  local_f8 = local_108;
                }
                else {
                  if (0 < (int)local_e8) {
                    uVar13 = 0;
                    do {
                      bVar4 = StatisticsAccumulation::GetNumData
                                        (pSVar15,local_b0.
                                                 super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + uVar13,
                                         &local_10c);
                      local_114 = 1;
                      if (bVar4) {
                        if (local_10c < this->min_num_vector_in_cluster_) {
                          uVar10 = (uint)this->num_order_ >> 0x1f;
                          local_114 = 0x1d;
                          if (-1 < this->num_order_) {
                            lVar8 = -1;
                            do {
                              bVar4 = NormalDistributedRandomValueGeneration::Get
                                                (&local_68,(double *)&local_e0);
                              uVar12 = local_100;
                              if (!bVar4) {
                                local_114 = 1;
                                break;
                              }
                              dVar16 = this->splitting_factor_ *
                                       (double)CONCAT44(local_e0._4_4_,(int)local_e0);
                              pvVar1 = (codebook_vectors->
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start;
                              lVar14 = *(long *)&pvVar1[(long)local_f8].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data;
                              *(double *)
                               (*(long *)&pvVar1[uVar13].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data + 8 + lVar8 * 8) =
                                   *(double *)(lVar14 + 8 + lVar8 * 8) - dVar16;
                              *(double *)(lVar14 + 8 + lVar8 * 8) =
                                   dVar16 + *(double *)(lVar14 + 8 + lVar8 * 8);
                              lVar8 = lVar8 + 1;
                              uVar10 = (uint)(this->num_order_ <= lVar8);
                            } while (lVar8 < this->num_order_);
                          }
                          pSVar15 = local_f0;
                          if (uVar10 == 0) goto LAB_00107008;
                        }
                        local_114 = 0;
                      }
LAB_00107008:
                      if (local_114 != 0) goto LAB_0010701f;
                      uVar13 = uVar13 + 1;
                    } while (uVar13 != local_c0);
                  }
                  local_114 = 0x1a;
LAB_0010701f:
                  if (local_114 == 0x1a) {
                    local_114 = 0;
                  }
                  local_f8 = local_108;
                }
              }
            }
            if (local_114 != 0) goto LAB_00107040;
            iVar5 = iVar5 + 1;
          } while (iVar5 < this->num_iteration_);
        }
        local_114 = 0xe;
LAB_00107040:
      } while (local_114 == 0xe);
      local_108 = (double)CONCAT71(local_108._1_7_,local_114 == 2);
LAB_00107051:
      if (local_108._0_1_ == '\0') {
        bVar2 = false;
      }
      else {
        uVar11 = (uint)local_100;
        bVar2 = (int)uVar11 < 1;
        if (0 < (int)uVar11) {
          lVar8 = 0;
          lVar9 = 0;
          uVar12 = 1;
          local_100 = (ulong)(uVar11 & 0x7fffffff);
          do {
            bVar4 = VectorQuantization::Run
                              (local_b8,(vector<double,_std::allocator<double>_> *)
                                        ((long)&(((local_c8->
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                super__Vector_base<double,_std::allocator<double>_>)
                                                ._M_impl.super__Vector_impl_data + lVar9),
                               codebook_vectors,
                               (int *)((long)(local_d0->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_start + lVar8));
            if (!bVar4) break;
            bVar2 = local_100 <= uVar12;
            lVar9 = lVar9 + 0x18;
            lVar8 = lVar8 + 4;
            bVar4 = uVar12 != (uVar11 & 0x7fffffff);
            uVar12 = uVar12 + 1;
          } while (bVar4);
        }
      }
      std::
      vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
      ::~vector(&local_b0);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool LindeBuzoGrayAlgorithm::Run(
    const std::vector<std::vector<double> >& input_vectors,
    std::vector<std::vector<double> >* codebook_vectors,
    std::vector<int>* codebook_indices, double* total_distance) const {
  // Check inputs.
  const int num_input_vector(static_cast<int>(input_vectors.size()));
  if (!is_valid_ ||
      num_input_vector < min_num_vector_in_cluster_ * target_codebook_size_ ||
      NULL == codebook_vectors || NULL == codebook_indices ||
      NULL == total_distance ||
      codebook_vectors->size() !=
          static_cast<std::size_t>(initial_codebook_size_)) {
    return false;
  }

  // Prepare memories.
  if (codebook_indices->size() != static_cast<std::size_t>(num_input_vector)) {
    codebook_indices->resize(num_input_vector);
  }
  std::vector<StatisticsAccumulation::Buffer> buffers(target_codebook_size_);

  // Prepare random value generator.
  NormalDistributedRandomValueGeneration random_value_generation(seed_);

  *total_distance = sptk::kMax;

  // Design codebook.
  int current_codebook_size(initial_codebook_size_);
  for (int next_codebook_size(current_codebook_size * 2);
       next_codebook_size <= target_codebook_size_; next_codebook_size *= 2) {
    // Double codebook size.
    codebook_vectors->resize(next_codebook_size);
    for (std::vector<std::vector<double> >::iterator itr(
             codebook_vectors->begin() + current_codebook_size);
         itr != codebook_vectors->end(); ++itr) {
      itr->resize(num_order_ + 1);
    }

    // Perturb codebook vectors.
    for (int i(0); i < current_codebook_size; ++i) {
      for (int m(0); m <= num_order_; ++m) {
        double random_value;
        if (!random_value_generation.Get(&random_value)) {
          return false;
        }
        const double perturbation(splitting_factor_ * random_value);
        const int j(i + current_codebook_size);
        (*codebook_vectors)[j][m] = (*codebook_vectors)[i][m] - perturbation;
        (*codebook_vectors)[i][m] = (*codebook_vectors)[i][m] + perturbation;
      }
    }

    current_codebook_size = next_codebook_size;

    double prev_total_distance(sptk::kMax);
    for (int n(0); n < num_iteration_; ++n) {
      // Initialize.
      double sum(0.0);
      for (int i(0); i < current_codebook_size; ++i) {
        statistics_accumulation_.Clear(&(buffers[i]));
      }

      // Accumulate statistics (E-step).
      for (int t(0); t < num_input_vector; ++t) {
        int index;
        if (!vector_quantization_.Run(input_vectors[t], *codebook_vectors,
                                      &index)) {
          return false;
        }
        (*codebook_indices)[t] = index;

        if (!statistics_accumulation_.Run(input_vectors[t],
                                          &(buffers[index]))) {
          return false;
        }

        double distance;
        if (!distance_calculation_.Run(input_vectors[t],
                                       (*codebook_vectors)[index], &distance)) {
          return false;
        }
        sum += distance;
      }
      *total_distance = sum / num_input_vector;

      // Check convergence.
      const double criterion_value(
          std::fabs(prev_total_distance - *total_distance) / *total_distance);
      if (0.0 == *total_distance || criterion_value < convergence_threshold_) {
        break;
      }
      prev_total_distance = *total_distance;

      // Update codebook (M-step) and find a maximum cluster.
      int majority_index(-1);
      int max_num_vector_in_cluster(0);
      for (int i(0); i < current_codebook_size; ++i) {
        int num_vector;
        if (!statistics_accumulation_.GetNumData(buffers[i], &num_vector)) {
          return false;
        }

        if (max_num_vector_in_cluster < num_vector) {
          majority_index = i;
          max_num_vector_in_cluster = num_vector;
        }

        // Update if the cluster contains enough data.
        if (min_num_vector_in_cluster_ <= num_vector) {
          if (!statistics_accumulation_.GetMean(buffers[i],
                                                &((*codebook_vectors)[i]))) {
            return false;
          }
        }
      }

      // Update the remaining centroids.
      for (int i(0); i < current_codebook_size; ++i) {
        int num_vector;
        if (!statistics_accumulation_.GetNumData(buffers[i], &num_vector)) {
          return false;
        }

        if (num_vector < min_num_vector_in_cluster_) {
          for (int m(0); m <= num_order_; ++m) {
            double random_value;
            if (!random_value_generation.Get(&random_value)) {
              return false;
            }
            const double perturbation(splitting_factor_ * random_value);
            const int j(majority_index);
            (*codebook_vectors)[i][m] =
                (*codebook_vectors)[j][m] - perturbation;
            (*codebook_vectors)[j][m] =
                (*codebook_vectors)[j][m] + perturbation;
          }
        }
      }
    }
  }

  // Save final results.
  for (int t(0); t < num_input_vector; ++t) {
    if (!vector_quantization_.Run(input_vectors[t], *codebook_vectors,
                                  &((*codebook_indices)[t]))) {
      return false;
    }
  }

  return true;
}